

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O0

void helper_msa_pcnt_w_mips(CPUMIPSState *env,uint32_t wd,uint32_t ws)

{
  fpr_t *pfVar1;
  fpr_t *pfVar2;
  int64_t iVar3;
  wr_t *pws;
  wr_t *pwd;
  uint32_t ws_local;
  uint32_t wd_local;
  CPUMIPSState *env_local;
  
  pfVar1 = (env->active_fpu).fpr + wd;
  pfVar2 = (env->active_fpu).fpr + ws;
  iVar3 = msa_pcnt_df(2,(long)(int)pfVar2->fs[0]);
  pfVar1->fs[0] = (float32)iVar3;
  iVar3 = msa_pcnt_df(2,(long)(int)pfVar2->fs[1]);
  pfVar1->fs[1] = (float32)iVar3;
  iVar3 = msa_pcnt_df(2,(long)(int)pfVar2->fs[2]);
  pfVar1->fs[2] = (float32)iVar3;
  iVar3 = msa_pcnt_df(2,(long)(int)pfVar2->fs[3]);
  pfVar1->fs[3] = (float32)iVar3;
  return;
}

Assistant:

void helper_msa_pcnt_w(CPUMIPSState *env, uint32_t wd, uint32_t ws)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);

    pwd->w[0]  = msa_pcnt_df(DF_WORD, pws->w[0]);
    pwd->w[1]  = msa_pcnt_df(DF_WORD, pws->w[1]);
    pwd->w[2]  = msa_pcnt_df(DF_WORD, pws->w[2]);
    pwd->w[3]  = msa_pcnt_df(DF_WORD, pws->w[3]);
}